

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_dogstatsd.cpp
# Opt level: O0

int __thiscall datadog::Dogstatsd::flush(Dogstatsd *this)

{
  int iVar1;
  bool bVar2;
  streamoff sVar3;
  long lVar4;
  reference pvVar5;
  ostream *this_00;
  void *pvVar6;
  size_t sVar7;
  ssize_t sVar8;
  undefined1 auVar9 [16];
  string local_228 [8];
  string buffer;
  allocator local_201;
  string local_200 [32];
  string local_1e0 [8];
  string buffer_1;
  undefined1 local_1b0 [16];
  undefined4 local_19c;
  long local_198;
  ostringstream statd;
  int local_1c;
  int ret;
  Dogstatsd *this_local;
  
  local_1c = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  if ((this->buffered & 1U) == 0) {
    this_local._4_4_ = 0;
    local_19c = 1;
  }
  else {
    while( true ) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->cmd_buffer);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      auVar9 = std::ostream::tellp();
      local_1b0 = auVar9;
      sVar3 = std::fpos::operator_cast_to_long((fpos *)local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back(&this->cmd_buffer);
      lVar4 = std::__cxx11::string::length();
      if (0xffbb < (ulong)((int)sVar3 + lVar4)) {
        std::__cxx11::ostringstream::str();
        iVar1 = this->_sockfd;
        pvVar6 = (void *)std::__cxx11::string::c_str();
        sVar7 = std::__cxx11::string::length();
        sVar8 = sendto(iVar1,pvVar6,sVar7,0,(sockaddr *)&this->_server,0x10);
        local_1c = local_1c + (int)sVar8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"",&local_201);
        std::__cxx11::ostringstream::str((string *)&local_198);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        std::ios::clear((long)&local_198 + *(long *)(local_198 + -0x18),0);
        std::__cxx11::string::~string(local_1e0);
      }
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(&this->cmd_buffer);
      this_00 = std::operator<<((ostream *)&local_198,(string *)pvVar5);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(&this->cmd_buffer);
    }
    std::__cxx11::ostringstream::str();
    iVar1 = this->_sockfd;
    pvVar6 = (void *)std::__cxx11::string::c_str();
    sVar7 = std::__cxx11::string::length();
    sVar8 = sendto(iVar1,pvVar6,sVar7,0,(sockaddr *)&this->_server,0x10);
    this_local._4_4_ = local_1c + (int)sVar8;
    local_19c = 1;
    std::__cxx11::string::~string(local_228);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  return this_local._4_4_;
}

Assistant:

int Dogstatsd::flush(){
    int ret = 0;
    std::ostringstream statd;
    if(!buffered) {
      return 0;
    }
    while (!cmd_buffer.empty()) {
      if (static_cast<int>(statd.tellp()) + cmd_buffer.back().length() > optimal_payload) {
        std::string buffer(statd.str());
        ret += sendto( _sockfd, buffer.c_str(), buffer.length(), 
            0, (struct sockaddr *)&_server, sizeof(_server));

        //clear the stringstream
        statd.str("");
        statd.clear();
      }
      statd << cmd_buffer.back() << std::endl;
      cmd_buffer.pop_back();
    }

    std::string buffer(statd.str());
    ret += sendto(_sockfd, buffer.c_str(), buffer.length(), 0, (struct sockaddr *)&_server, sizeof(_server));

    return ret;
  }